

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileFStream::SetBuffer(FileFStream *this,char *buffer,size_t size)

{
  allocator local_bc;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (size != 0 && buffer == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_b8,"Toolkit",&local_b9);
    std::__cxx11::string::string((string *)&local_38,"transport::file::FileFStream",&local_ba);
    std::__cxx11::string::string((string *)&local_58,"SetBuffer",&local_bb);
    std::__cxx11::string::string
              ((string *)&local_78,"buffer size must be 0 when using a NULL buffer",&local_bc);
    helper::Throw<std::invalid_argument>(&local_b8,&local_38,&local_58,&local_78,-1);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  (**(code **)(*(long *)&this->field_0x108 + 0x18))(&this->field_0x108,buffer,size);
  std::operator+(&local_b8,"couldn\'t set buffer in file ",&(this->super_Transport).m_Name);
  std::operator+(&local_98,&local_b8,", in call to fstream rdbuf()->pubsetbuf");
  CheckFile(this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void FileFStream::SetBuffer(char *buffer, size_t size)
{
    if (!buffer && size != 0)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "transport::file::FileFStream", "SetBuffer",
                                             "buffer size must be 0 when using a NULL buffer");
    }
    m_FileStream.rdbuf()->pubsetbuf(buffer, size);
    CheckFile("couldn't set buffer in file " + m_Name + ", in call to fstream rdbuf()->pubsetbuf");
}